

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_cnt.c
# Opt level: O1

HPDF_STATUS HPDF_UseCNTFonts(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_FontDef p_Var2;
  HPDF_STATUS HVar3;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    HVar3 = 0x1025;
  }
  else {
    p_Var2 = HPDF_CIDFontDef_New(pdf->mmgr,"MingLiU",MingLiU_Init);
    HVar3 = HPDF_Doc_RegisterFontDef(pdf,p_Var2);
    if (HVar3 == 0) {
      p_Var2 = HPDF_CIDFontDef_New(pdf->mmgr,"MingLiU,Bold",MingLiU_Bold_Init);
      HVar3 = HPDF_Doc_RegisterFontDef(pdf,p_Var2);
      if (HVar3 == 0) {
        p_Var2 = HPDF_CIDFontDef_New(pdf->mmgr,"MingLiU,Italic",MingLiU_Italic_Init);
        HVar3 = HPDF_Doc_RegisterFontDef(pdf,p_Var2);
        if (HVar3 == 0) {
          p_Var2 = HPDF_CIDFontDef_New(pdf->mmgr,"MingLiU,BoldItalic",MingLiU_BoldItalic_Init);
          HVar3 = HPDF_Doc_RegisterFontDef(pdf,p_Var2);
          return HVar3;
        }
      }
    }
  }
  return HVar3;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_UseCNTFonts   (HPDF_Doc   pdf)
{
    HPDF_FontDef fontdef;
    HPDF_STATUS ret;

    if (!HPDF_HasDoc (pdf))
        return HPDF_INVALID_DOCUMENT;

    /* MingLiU */
    fontdef = HPDF_CIDFontDef_New (pdf->mmgr,  "MingLiU",
                MingLiU_Init);

    if ((ret = HPDF_Doc_RegisterFontDef (pdf, fontdef)) != HPDF_OK)
        return ret;

    fontdef = HPDF_CIDFontDef_New (pdf->mmgr,  "MingLiU,Bold",
                MingLiU_Bold_Init);

    if ((ret = HPDF_Doc_RegisterFontDef (pdf, fontdef)) != HPDF_OK)
        return ret;

    fontdef = HPDF_CIDFontDef_New (pdf->mmgr,  "MingLiU,Italic",
                MingLiU_Italic_Init);

    if ((ret = HPDF_Doc_RegisterFontDef (pdf, fontdef)) != HPDF_OK)
        return ret;

    fontdef = HPDF_CIDFontDef_New (pdf->mmgr,  "MingLiU,BoldItalic",
                MingLiU_BoldItalic_Init);

    if ((ret = HPDF_Doc_RegisterFontDef (pdf, fontdef)) != HPDF_OK)
        return ret;

    return HPDF_OK;
}